

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::PlatformSupportsAppleTextStubs(cmMakefile *this)

{
  bool bVar1;
  bool local_8a;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  cmMakefile *local_18;
  cmMakefile *this_local;
  
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"APPLE",&local_39);
  bVar1 = IsOn(this,&local_38);
  local_8a = false;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"CMAKE_TAPI",&local_71);
    local_8a = IsSet(this,&local_70);
  }
  this_local._7_1_ = local_8a;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::PlatformSupportsAppleTextStubs() const
{
  return this->IsOn("APPLE") && this->IsSet("CMAKE_TAPI");
}